

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

HelperCallOpnd * IR::HelperCallOpnd::New(JnHelperMethod fnHelper,Func *func)

{
  HelperCallOpnd *this;
  
  this = (HelperCallOpnd *)new<Memory::JitArenaAllocator>(0x18,func->m_alloc,0x3d6ef4);
  (this->super_Opnd)._vptr_Opnd = (_func_int **)0x0;
  (this->super_Opnd).m_valueType = (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
  (this->super_Opnd).m_type = TyIllegal;
  (this->super_Opnd).field_0xb = 0;
  (this->super_Opnd).m_kind = OpndKindInvalid;
  (this->super_Opnd).isDeleted = false;
  *(undefined2 *)&(this->super_Opnd).field_0xe = 0;
  *(undefined8 *)&this->m_fnHelper = 0;
  HelperCallOpnd(this);
  Init(this,fnHelper);
  return this;
}

Assistant:

HelperCallOpnd *
HelperCallOpnd::New(JnHelperMethod fnHelper, Func *func)
{
    HelperCallOpnd *helperCallOpnd = JitAnew(func->m_alloc, IR::HelperCallOpnd);
    helperCallOpnd->Init(fnHelper);

    return helperCallOpnd;
}